

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCreateEngine(uint32_t dwCreationFlags,FACTAudioEngine **ppEngine)

{
  uint32_t uVar1;
  FAudioMallocFunc in_RSI;
  undefined4 in_EDI;
  uint32_t unaff_retaddr;
  FAudioFreeFunc in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  
  uVar1 = FACTCreateEngineWithCustomAllocatorEXT
                    (unaff_retaddr,(FACTAudioEngine **)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                     in_RSI,in_stack_ffffffffffffffe8,(FAudioReallocFunc)0x110020);
  return uVar1;
}

Assistant:

uint32_t FACTCreateEngine(
	uint32_t dwCreationFlags,
	FACTAudioEngine **ppEngine
) {
	return FACTCreateEngineWithCustomAllocatorEXT(
		dwCreationFlags,
		ppEngine,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}